

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O0

void __thiscall Js::StackScriptFunction::BoxState::Finish(BoxState *this)

{
  BoxState *this_local;
  
  JsUtil::
  BaseHashSet<Js::FunctionBody*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::FunctionBody*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  ::Map<Js::StackScriptFunction::BoxState::Finish()::__0>
            ((BaseHashSet<Js::FunctionBody*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::FunctionBody*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              *)this);
  return;
}

Assistant:

void StackScriptFunction::BoxState::Finish()
    {
        frameToBox.Map([](FunctionBody * body)
        {
            body->SetStackNestedFunc(false);
        });
    }